

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::DrawAndCheck<float>
          (AttributeFormatTest *this,GLint size,bool normalized)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  long lVar6;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar7;
  double local_628;
  char *local_618;
  char *local_610;
  MessageBuilder local_608;
  string local_488 [32];
  stringstream local_468 [8];
  stringstream ss_1;
  undefined1 local_458 [376];
  int local_2e0;
  allocator<char> local_2d9;
  GLint j_2;
  string result_str;
  stringstream local_298 [8];
  stringstream ss;
  undefined1 local_288 [376];
  int local_110;
  GLint j_1;
  allocator<char> local_f9;
  string local_f8 [8];
  string reference_str;
  int local_d0;
  GLint i_2;
  GLint j;
  GLint i_1;
  float reference [8];
  float array_data [16];
  GLdouble scale;
  GLfloat local_58;
  GLint i;
  float result [8];
  float *result_ptr;
  Functions *gl;
  bool normalized_local;
  GLint size_local;
  AttributeFormatTest *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x1680))(this->m_po);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91b);
  (**(code **)(lVar5 + 0xd8))(this->m_vao);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91e);
  (**(code **)(lVar5 + 0x30))(0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x922);
  (**(code **)(lVar5 + 0x538))(0,0,2);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x925);
  (**(code **)(lVar5 + 0x638))();
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x928);
  lVar6 = (**(code **)(lVar5 + 0xcf8))(0x8c8e,35000);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x92c);
  memset(&local_58,0,0x20);
  for (scale._4_4_ = 0; SBORROW4(scale._4_4_,size * 2) != scale._4_4_ + size * -2 < 0;
      scale._4_4_ = scale._4_4_ + 1) {
    (&local_58)[scale._4_4_] = *(GLfloat *)(lVar6 + (long)scale._4_4_ * 4);
  }
  (**(code **)(lVar5 + 0x1670))(0x8c8e);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x936);
  local_628 = 0.0625;
  if (!normalized) {
    local_628 = 1.0;
  }
  reference[6] = (float)(local_628 * 0.0);
  reference[7] = (float)(local_628 * 1.0);
  memset(&j,0,0x20);
  for (i_2 = 0; i_2 < 2; i_2 = i_2 + 1) {
    for (local_d0 = 0; local_d0 < size; local_d0 = local_d0 + 1) {
      (&j)[i_2 * size + local_d0] =
           (GLint)(reference[(long)(i_2 * size * 2 + local_d0) + 6] +
                  reference[(long)(i_2 * size * 2 + local_d0 + size) + 6]);
    }
  }
  reference_str.field_2._12_4_ = 0;
  while( true ) {
    if (SBORROW4(reference_str.field_2._12_4_,size * 2) ==
        reference_str.field_2._12_4_ + size * -2 < 0) {
      return true;
    }
    bVar1 = compare<float>(this,(GLfloat)(&j)[(int)reference_str.field_2._12_4_],
                           (&local_58)[(int)reference_str.field_2._12_4_]);
    if (!bVar1) break;
    reference_str.field_2._12_4_ = reference_str.field_2._12_4_ + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"[ ",&local_f9);
  std::allocator<char>::~allocator(&local_f9);
  for (local_110 = 0; SBORROW4(local_110,size * 2) != local_110 + size * -2 < 0;
      local_110 = local_110 + 1) {
    std::__cxx11::stringstream::stringstream(local_298);
    std::ostream::operator<<(local_288,(float)(&j)[local_110]);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::append(local_f8);
    std::__cxx11::string::~string((string *)(result_str.field_2._M_local_buf + 8));
    if (local_110 < size * 2 + -1) {
      std::__cxx11::string::append((char *)local_f8);
    }
    else {
      std::__cxx11::string::append((char *)local_f8);
    }
    std::__cxx11::stringstream::~stringstream(local_298);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&j_2,"[ ",&local_2d9);
  std::allocator<char>::~allocator(&local_2d9);
  for (local_2e0 = 0; SBORROW4(local_2e0,size * 2) != local_2e0 + size * -2 < 0;
      local_2e0 = local_2e0 + 1) {
    std::__cxx11::stringstream::stringstream(local_468);
    std::ostream::operator<<(local_458,(&local_58)[local_2e0]);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::append((string *)&j_2);
    std::__cxx11::string::~string(local_488);
    if (local_2e0 < size * 2 + -1) {
      std::__cxx11::string::append((char *)&j_2);
    }
    else {
      std::__cxx11::string::append((char *)&j_2);
    }
    std::__cxx11::stringstream::~stringstream(local_468);
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_608,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_608,(char (*) [27])"Result vector is equal to ");
  local_610 = (char *)std::__cxx11::string::c_str();
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_610);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [7])0x2a796ef);
  local_618 = (char *)std::__cxx11::string::c_str();
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_618);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [15])0x2a7d12b);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_608);
  std::__cxx11::string::~string((string *)&j_2);
  std::__cxx11::string::~string(local_f8);
  return false;
}

Assistant:

bool AttributeFormatTest::DrawAndCheck(glw::GLint size, bool normalized)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup state. */
	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Draw. */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_POINTS, 0, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	/* Result query. */
	T* result_ptr = (T*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	T result[8] = { 0 };

	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		result[i] = result_ptr[i];
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	const glw::GLdouble scale = normalized ? (1.0 / 16.0) /* Floating point scalling factor. */ : 1.0;

	const T array_data[16] = { (T)(0.0 * scale),  (T)(1.0 * scale),  (T)(2.0 * scale),  (T)(3.0 * scale),
							   (T)(4.0 * scale),  (T)(5.0 * scale),  (T)(6.0 * scale),  (T)(7.0 * scale),
							   (T)(8.0 * scale),  (T)(9.0 * scale),  (T)(10.0 * scale), (T)(11.0 * scale),
							   (T)(12.0 * scale), (T)(13.0 * scale), (T)(14.0 * scale), (T)(15.0 * scale) };

	T reference[8] = { 0 };

	for (glw::GLint i = 0; i < 2 /* two points */; ++i)
	{
		for (glw::GLint j = 0; j < size /* size components */; ++j)
		{
			reference[i * size + j] = array_data[i * size * 2 + j] + array_data[i * size * 2 + j + size];
		}
	}

	/* Check result and return. */
	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		if (!AttributeFormatTest::compare<T>(reference[i], result[i]))
		{
			std::string reference_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << reference[j];

				reference_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					reference_str.append(", ");
				}
				else
				{
					reference_str.append(" ]");
				}
			}

			std::string result_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << result[j];

				result_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					result_str.append(", ");
				}
				else
				{
					result_str.append(" ]");
				}
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result vector is equal to "
												<< result_str.c_str() << ", but " << reference_str.c_str()
												<< " was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}